

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colorspace.cpp
# Opt level: O1

RGBColorSpace * pbrt::RGBColorSpace::Lookup(Point2f r,Point2f g,Point2f b,Point2f w)

{
  float fVar1;
  RGBColorSpace *pRVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  RGBColorSpace *pRVar9;
  long lVar10;
  float fVar11;
  undefined8 in_XMM0_Qb;
  float fVar12;
  undefined8 in_XMM1_Qb;
  float fVar13;
  undefined8 in_XMM2_Qb;
  float fVar14;
  undefined8 in_XMM3_Qb;
  float fVar15;
  undefined1 auVar16 [16];
  RGBColorSpace *local_20 [4];
  
  fVar14 = w.super_Tuple2<pbrt::Point2,_float>.x;
  fVar13 = b.super_Tuple2<pbrt::Point2,_float>.x;
  fVar12 = g.super_Tuple2<pbrt::Point2,_float>.x;
  fVar11 = r.super_Tuple2<pbrt::Point2,_float>.x;
  local_20[0] = ACES2065_1;
  local_20[1] = (RGBColorSpace *)DCI_P3;
  local_20[2] = (RGBColorSpace *)Rec2020;
  local_20[3] = sRGB;
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = r.super_Tuple2<pbrt::Point2,_float>;
  auVar4 = vmovshdup_avx(auVar4);
  auVar5._8_8_ = in_XMM1_Qb;
  auVar5._0_8_ = g.super_Tuple2<pbrt::Point2,_float>;
  auVar5 = vmovshdup_avx(auVar5);
  auVar6._8_8_ = in_XMM2_Qb;
  auVar6._0_8_ = b.super_Tuple2<pbrt::Point2,_float>;
  auVar6 = vmovshdup_avx(auVar6);
  auVar7._8_8_ = in_XMM3_Qb;
  auVar7._0_8_ = w.super_Tuple2<pbrt::Point2,_float>;
  auVar7 = vmovshdup_avx(auVar7);
  lVar10 = 0;
  auVar16._8_4_ = 0x7fffffff;
  auVar16._0_8_ = 0x7fffffff7fffffff;
  auVar16._12_4_ = 0x7fffffff;
  pRVar9 = sRGB;
  do {
    pRVar2 = *(RGBColorSpace **)((long)local_20 + lVar10);
    fVar1 = (pRVar2->r).super_Tuple2<pbrt::Point2,_float>.x;
    if (((fVar11 == fVar1) && (!NAN(fVar11) && !NAN(fVar1))) ||
       (auVar3 = vandps_avx(ZEXT416((uint)((fVar11 - fVar1) / fVar1)),auVar16), auVar3._0_4_ < 0.001
       )) {
      fVar1 = (pRVar2->r).super_Tuple2<pbrt::Point2,_float>.y;
      fVar15 = auVar4._0_4_;
      if (((fVar15 != fVar1) || (NAN(fVar15) || NAN(fVar1))) &&
         (auVar3 = vandps_avx(ZEXT416((uint)((fVar15 - fVar1) / fVar1)),auVar16),
         0.001 <= auVar3._0_4_)) goto LAB_0022d9c2;
      fVar1 = (pRVar2->g).super_Tuple2<pbrt::Point2,_float>.x;
      if (((fVar12 != fVar1) || (NAN(fVar12) || NAN(fVar1))) &&
         (auVar3 = vandps_avx(ZEXT416((uint)((fVar12 - fVar1) / fVar1)),auVar16),
         0.001 <= auVar3._0_4_)) goto LAB_0022d9c2;
      fVar1 = (pRVar2->g).super_Tuple2<pbrt::Point2,_float>.y;
      fVar15 = auVar5._0_4_;
      if (((fVar15 != fVar1) || (NAN(fVar15) || NAN(fVar1))) &&
         (auVar3 = vandps_avx(ZEXT416((uint)((fVar15 - fVar1) / fVar1)),auVar16),
         0.001 <= auVar3._0_4_)) goto LAB_0022d9c2;
      fVar1 = (pRVar2->b).super_Tuple2<pbrt::Point2,_float>.x;
      if (((fVar13 != fVar1) || (NAN(fVar13) || NAN(fVar1))) &&
         (auVar3 = vandps_avx(ZEXT416((uint)((fVar13 - fVar1) / fVar1)),auVar16),
         0.001 <= auVar3._0_4_)) goto LAB_0022d9c2;
      fVar1 = (pRVar2->b).super_Tuple2<pbrt::Point2,_float>.y;
      fVar15 = auVar6._0_4_;
      if (((fVar15 != fVar1) || (NAN(fVar15) || NAN(fVar1))) &&
         (auVar3 = vandps_avx(ZEXT416((uint)((fVar15 - fVar1) / fVar1)),auVar16),
         0.001 <= auVar3._0_4_)) goto LAB_0022d9c2;
      fVar1 = (pRVar2->w).super_Tuple2<pbrt::Point2,_float>.x;
      if (((fVar14 != fVar1) || (NAN(fVar14) || NAN(fVar1))) &&
         (auVar3 = vandps_avx(ZEXT416((uint)((fVar14 - fVar1) / fVar1)),auVar16),
         0.001 <= auVar3._0_4_)) goto LAB_0022d9c2;
      fVar1 = (pRVar2->w).super_Tuple2<pbrt::Point2,_float>.y;
      fVar15 = auVar7._0_4_;
      if (((fVar15 != fVar1) || (NAN(fVar15) || NAN(fVar1))) &&
         (auVar3 = vandps_avx(ZEXT416((uint)((fVar15 - fVar1) / fVar1)),auVar16),
         0.001 <= auVar3._0_4_)) goto LAB_0022d9c2;
      bVar8 = false;
      pRVar9 = pRVar2;
    }
    else {
LAB_0022d9c2:
      bVar8 = true;
    }
    if (!bVar8) {
      return pRVar9;
    }
    lVar10 = lVar10 + 8;
    if (lVar10 == 0x20) {
      return (RGBColorSpace *)0x0;
    }
  } while( true );
}

Assistant:

const RGBColorSpace *RGBColorSpace::Lookup(Point2f r, Point2f g, Point2f b, Point2f w) {
    auto closeEnough = [](const Point2f &a, const Point2f &b) {
        return ((a.x == b.x || std::abs((a.x - b.x) / b.x) < 1e-3) &&
                (a.y == b.y || std::abs((a.y - b.y) / b.y) < 1e-3));
    };
    for (const RGBColorSpace *cs : {ACES2065_1, DCI_P3, Rec2020, sRGB}) {
        if (closeEnough(r, cs->r) && closeEnough(g, cs->g) && closeEnough(b, cs->b) &&
            closeEnough(w, cs->w))
            return cs;
    }
    return nullptr;
}